

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

duckdb_logical_type duckdb_create_array_type(duckdb_logical_type type,idx_t array_size)

{
  LogicalType *this;
  optional_idx local_40;
  LogicalType local_38;
  
  if (array_size < 100000 && type != (duckdb_logical_type)0x0) {
    this = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this);
    duckdb::optional_idx::optional_idx(&local_40,array_size);
    duckdb::LogicalType::ARRAY(&local_38,(LogicalType *)type,local_40);
    duckdb::LogicalType::operator=(this,&local_38);
    duckdb::LogicalType::~LogicalType(&local_38);
  }
  else {
    this = (LogicalType *)0x0;
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_create_array_type(duckdb_logical_type type, idx_t array_size) {
	if (!type) {
		return nullptr;
	}
	if (array_size >= duckdb::ArrayType::MAX_ARRAY_SIZE) {
		return nullptr;
	}
	duckdb::LogicalType *ltype = new duckdb::LogicalType;
	*ltype = duckdb::LogicalType::ARRAY(*reinterpret_cast<duckdb::LogicalType *>(type), array_size);
	return reinterpret_cast<duckdb_logical_type>(ltype);
}